

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O2

void LabelDict::add_example_namespace(example *ec,namespace_index ns,features *fs)

{
  namespace_index *pnVar1;
  uchar *puVar2;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  float *pfVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  namespace_index local_41;
  example *local_40;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  puVar2 = (ec->super_example_predict).indices._begin;
  lVar6 = 0;
  do {
    if ((long)(ec->super_example_predict).indices._end - (long)puVar2 == lVar6) {
      local_41 = ns;
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&local_41);
      break;
    }
    pnVar1 = puVar2 + lVar6;
    lVar6 = lVar6 + 1;
  } while (*pnVar1 != ns);
  psVar3 = (fs->space_names)._begin;
  psVar4 = (fs->space_names)._end;
  local_38 = &(ec->super_example_predict).feature_space[ns].space_names;
  lVar6 = 0;
  local_40 = ec;
  for (uVar7 = 0; pfVar5 = (fs->values)._begin,
      uVar7 < (ulong)((long)(fs->values)._end - (long)pfVar5 >> 2); uVar7 = uVar7 + 1) {
    features::push_back((ec->super_example_predict).feature_space + ns,pfVar5[uVar7],
                        (fs->indicies)._begin[uVar7]);
    if (psVar4 != psVar3) {
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(local_38,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&(((fs->space_names)._begin)->
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar6));
    }
    lVar6 = lVar6 + 0x10;
  }
  local_40->total_sum_feat_sq = fs->sum_feat_sq + local_40->total_sum_feat_sq;
  local_40->num_features =
       local_40->num_features + ((long)(fs->values)._end - (long)(fs->values)._begin >> 2);
  return;
}

Assistant:

void add_example_namespace(example& ec, namespace_index ns, features& fs)
{
  bool has_ns = false;
  for (size_t i = 0; i < ec.indices.size(); i++)
    if (ec.indices[i] == (size_t)ns)
    {
      has_ns = true;
      break;
    }

  if (!has_ns)
    ec.indices.push_back((size_t)ns);

  bool audit = fs.space_names.size() > 0;
  features& add_fs = ec.feature_space[(size_t)ns];
  for (size_t i = 0; i < fs.size(); ++i)
  {
    add_fs.push_back(fs.values[i], fs.indicies[i]);
    if (audit)
      add_fs.space_names.push_back(fs.space_names[i]);
  }
  ec.total_sum_feat_sq += fs.sum_feat_sq;

  ec.num_features += fs.size();
}